

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Homogeneous.h
# Opt level: O1

void __thiscall
Eigen::internal::
homogeneous_left_product_impl<Eigen::Homogeneous<Eigen::Matrix<float,3,1,0,3,1>,0>,Eigen::Matrix<float,4,4,0,4,4>>
::evalTo<Eigen::Matrix<float,4,1,0,4,1>>
          (homogeneous_left_product_impl<Eigen::Homogeneous<Eigen::Matrix<float,3,1,0,3,1>,0>,Eigen::Matrix<float,4,4,0,4,4>>
           *this,Matrix<float,_4,_1,_0,_4,_1> *dst)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float *pfVar4;
  float *pfVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  PointerType ptr;
  
  pfVar4 = *(float **)this;
  pfVar5 = *(float **)(this + 8);
  fVar1 = *pfVar5;
  fVar2 = pfVar5[1];
  fVar3 = pfVar5[2];
  fVar7 = pfVar4[1];
  fVar8 = pfVar4[2];
  fVar9 = pfVar4[3];
  fVar10 = pfVar4[5];
  fVar11 = pfVar4[6];
  fVar12 = pfVar4[7];
  fVar13 = pfVar4[9];
  fVar14 = pfVar4[10];
  fVar15 = pfVar4[0xb];
  (dst->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array[0] =
       fVar3 * pfVar4[8] + fVar2 * pfVar4[4] + *pfVar4 * fVar1;
  (dst->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array[1] =
       fVar3 * fVar13 + fVar2 * fVar10 + fVar7 * fVar1;
  (dst->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array[2] =
       fVar3 * fVar14 + fVar2 * fVar11 + fVar8 * fVar1;
  (dst->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array[3] =
       fVar3 * fVar15 + fVar2 * fVar12 + fVar9 * fVar1;
  lVar6 = *(long *)this;
  if (((int)lVar6 + 0x30U & 0xf) == 0) {
    (dst->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array[0] =
         *(float *)(lVar6 + 0x30) +
         (dst->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
         [0];
    (dst->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array[1] =
         *(float *)(lVar6 + 0x34) +
         (dst->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
         [1];
    (dst->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array[2] =
         *(float *)(lVar6 + 0x38) +
         (dst->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
         [2];
    (dst->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array[3] =
         *(float *)(lVar6 + 0x3c) +
         (dst->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
         [3];
    return;
  }
  __assert_fail("((internal::UIntPtr(block.data()) % (((int)1 >= (int)evaluator<XprType>::Alignment) ? (int)1 : (int)evaluator<XprType>::Alignment)) == 0) && \"data is not aligned\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/CoreEvaluators.h"
                ,0x4ca,
                "Eigen::internal::block_evaluator<const Eigen::Matrix<float, 4, 4>, 4, 1, true>::block_evaluator(const XprType &) [ArgType = const Eigen::Matrix<float, 4, 4>, BlockRows = 4, BlockCols = 1, InnerPanel = true, HasDirectAccess = true]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC void evalTo(Dest& dst) const
  {
    // FIXME investigate how to allow lazy evaluation of this product when possible
    dst = Block<const LhsMatrixTypeNested,
              LhsMatrixTypeNested::RowsAtCompileTime,
              LhsMatrixTypeNested::ColsAtCompileTime==Dynamic?Dynamic:LhsMatrixTypeNested::ColsAtCompileTime-1>
            (m_lhs,0,0,m_lhs.rows(),m_lhs.cols()-1) * m_rhs;
    dst += m_lhs.col(m_lhs.cols()-1).rowwise()
            .template replicate<MatrixType::ColsAtCompileTime>(m_rhs.cols());
  }